

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item.c
# Opt level: O0

void borg_deinscribe(int i)

{
  int local_14;
  int local_10;
  int j_1;
  int j;
  int i_local;
  
  if ((borg_items[i].tval != '\x1c') || ((uint)borg_items[i].sval != sv_food_slime_mold)) {
    borg_keypress(0x7d);
    if (i < (int)(uint)z_info->pack_size) {
      borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[i]);
    }
    else if (i < (int)(z_info->pack_size + 0xb)) {
      for (local_10 = 0; local_10 < (int)(uint)z_info->pack_size; local_10 = local_10 + 1) {
        if ((borg_items[local_10].iqty != '\0') && (*borg_items[local_10].note == '{')) {
          borg_keypress(0x2f);
          break;
        }
      }
      borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"
                         [(int)(i - (uint)z_info->pack_size)]);
    }
    else {
      for (local_14 = 0; local_14 <= (int)(z_info->pack_size + 0xb); local_14 = local_14 + 1) {
        if ((borg_items[local_14].iqty != '\0') && (*borg_items[local_14].note == '{')) {
          borg_keypress(0x7c);
          break;
        }
      }
      borg_keypress((i - (z_info->pack_size + 0xc)) + 0x30);
    }
    borg_keypress(0x79);
    borg_keypress(0x79);
  }
  return;
}

Assistant:

void borg_deinscribe(int i)
{

    /* Ok to inscribe Slime Molds */
    if (borg_items[i].tval == TV_FOOD
        && borg_items[i].sval == sv_food_slime_mold)
        return;

    /* Label it */
    borg_keypress('}');

    /* Choose from inventory */
    if (i < INVEN_WIELD) {
        /* Choose the item */
        borg_keypress(all_letters_nohjkl[i]);
    }

    /* Choose from equipment */
    else {
        if (i < INVEN_FEET) {
            for (int j = 0; j < INVEN_WIELD; j++) {
                /* Go to equipment (if necessary) */
                if (borg_items[j].iqty && borg_items[j].note[0] == '{') {
                    borg_keypress('/');
                    break;
                }
            }
            /* Choose the item */
            borg_keypress(all_letters_nohjkl[i - INVEN_WIELD]);

        } 
        else {
            for (int j = 0; j <= INVEN_FEET; j++) {
                /* Go to quiver (if necessary) */
                if (borg_items[j].iqty && borg_items[j].note[0] == '{') {
                    borg_keypress('|');
                    break;
                }
            }
            /* Choose the item */
            borg_keypress('0' + (i - QUIVER_START));
        }
    }

    /* May ask for a confirmation */
    borg_keypress('y');
    borg_keypress('y');
}